

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

size_t __thiscall Bstrlib::String::getUnicodeLength(String *this)

{
  int iVar1;
  uchar *puVar2;
  int local_2c;
  int cnt;
  uchar *end;
  uchar *array;
  size_t size;
  String *this_local;
  
  array = (uchar *)0x0;
  end = (this->super_tagbstring).data;
  puVar2 = (this->super_tagbstring).data;
  iVar1 = (this->super_tagbstring).slen;
  local_2c = getUnicodeCharCount(end);
  while (local_2c != 0 && end < puVar2 + iVar1) {
    array = array + 1;
    end = end + local_2c;
    local_2c = getUnicodeCharCount(end);
  }
  return (size_t)array;
}

Assistant:

size_t String::getUnicodeLength() const
    {
        size_t size = 0;
        unsigned char * array = data, * end = data + slen;
        int cnt = getUnicodeCharCount(&array[size]);
        while (cnt && array < end)
        {
            size ++;
            array += cnt;
            cnt = getUnicodeCharCount(array);
        }
        return size;
    }